

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace.c
# Opt level: O3

int multifast_replace(AC_TRIE_t *thiz,AC_TEXT_t *instr,MF_REPLACE_MODE_t mode,
                     MF_REPLACE_CALBACK_f callback,void *param)

{
  AC_PATTERN_t *pAVar1;
  ac_trie *paVar2;
  AC_TEXT_t *pAVar3;
  ACT_NODE_t *pAVar4;
  ulong uVar5;
  mf_replacement_nominee *pmVar6;
  size_t *psVar7;
  size_t __n;
  int iVar8;
  ACT_NODE_t *nod;
  size_t sVar9;
  size_t sVar10;
  ulong to_position;
  ACT_NODE_t *pAVar11;
  ulong uVar12;
  
  iVar8 = -1;
  if (thiz->trie_open == 0) {
    if ((thiz->repdata).has_replacement == 0) {
      iVar8 = -2;
    }
    else {
      (thiz->repdata).cbf = callback;
      (thiz->repdata).user = param;
      (thiz->repdata).replace_mode = mode;
      thiz->text = instr;
      nod = thiz->last_node;
      if (instr->length == 0) {
        uVar12 = 0;
        uVar5 = 0;
      }
      else {
        uVar12 = 0;
        do {
          pAVar4 = node_find_next_bs(nod,instr->astring[uVar12]);
          if (pAVar4 == (ACT_NODE_t *)0x0) {
            pAVar4 = nod->failure_node;
            pAVar11 = pAVar4;
            if (pAVar4 == (ACT_NODE_t *)0x0) {
              pAVar11 = nod;
            }
            uVar12 = uVar12 + (pAVar4 == (ACT_NODE_t *)0x0);
            nod = pAVar11;
          }
          else {
            uVar12 = uVar12 + 1;
            nod = pAVar4;
            if ((pAVar4->final != 0) &&
               (pAVar1 = pAVar4->to_be_replaced, pAVar1 != (AC_PATTERN_t *)0x0)) {
              sVar9 = thiz->base_position + uVar12;
              uVar5 = sVar9 - (pAVar1->ptext).length;
              if ((thiz->repdata).replace_mode == MF_REPLACE_MODE_LAZY) {
                if (uVar5 < (thiz->repdata).curser) goto LAB_001097e3;
                sVar10 = (thiz->repdata).noms_size;
                if (sVar10 == 0) goto LAB_00109782;
                if (uVar5 < (thiz->repdata).noms[sVar10 - 1].position) goto LAB_001097e3;
              }
              else {
                sVar10 = (thiz->repdata).noms_size;
                if (sVar10 != 0) {
                  psVar7 = &(thiz->repdata).noms[sVar10 - 1].position;
                  do {
                    if (*psVar7 - (((mf_replacement_nominee *)(psVar7 + -1))->pattern->ptext).length
                        < uVar5) goto LAB_00109784;
                    psVar7 = psVar7 + -2;
                    sVar10 = sVar10 - 1;
                    (thiz->repdata).noms_size = sVar10;
                  } while (sVar10 != 0);
                }
LAB_00109782:
                sVar10 = 0;
              }
LAB_00109784:
              if (sVar10 == (thiz->repdata).noms_capacity) {
                if (sVar10 == 0) {
                  (thiz->repdata).noms_capacity = 0x80;
                  pmVar6 = (mf_replacement_nominee *)malloc(0x800);
                  (thiz->repdata).noms = pmVar6;
                  sVar10 = 0;
                }
                else {
                  (thiz->repdata).noms_capacity = sVar10 + 0x80;
                  pmVar6 = (mf_replacement_nominee *)
                           realloc((thiz->repdata).noms,(sVar10 + 0x80) * 0x10);
                  (thiz->repdata).noms = pmVar6;
                  sVar10 = (thiz->repdata).noms_size;
                }
              }
              else {
                pmVar6 = (thiz->repdata).noms;
              }
              pmVar6[sVar10].pattern = pAVar1;
              pmVar6[sVar10].position = sVar9;
              (thiz->repdata).noms_size = sVar10 + 1;
            }
          }
LAB_001097e3:
          uVar5 = instr->length;
        } while (uVar12 < uVar5);
      }
      to_position = (uVar5 + thiz->base_position) - nod->depth;
      mf_repdata_do_replace(&thiz->repdata,to_position);
      paVar2 = (thiz->repdata).trie;
      pAVar3 = paVar2->text;
      iVar8 = 0;
      psVar7 = &paVar2->base_position;
      uVar5 = 0;
      if (*psVar7 <= to_position) {
        uVar5 = to_position - *psVar7;
      }
      __n = pAVar3->length - uVar5;
      if (uVar5 <= pAVar3->length && __n != 0) {
        memcpy((thiz->repdata).backlog.astring + (thiz->repdata).backlog.length,
               pAVar3->astring + uVar5,__n);
        psVar7 = &(thiz->repdata).backlog.length;
        *psVar7 = *psVar7 + (pAVar3->length - uVar5);
      }
      thiz->last_node = nod;
      thiz->base_position = thiz->base_position + uVar12;
    }
  }
  return iVar8;
}

Assistant:

int multifast_replace (AC_TRIE_t *thiz, AC_TEXT_t *instr, 
        MF_REPLACE_MODE_t mode, MF_REPLACE_CALBACK_f callback, void *param)
{
    ACT_NODE_t *current;
    ACT_NODE_t *next;
    struct mf_replacement_nominee nom;
    MF_REPLACEMENT_DATA_t *rd = &thiz->repdata;
    
    size_t position_r = 0;  /* Relative current position in the input string */
    size_t backlog_pos = 0; /* Relative backlog position in the input string */
    
    if (thiz->trie_open)
        return -1; /* _finalize() must be called first */
    
    if (!rd->has_replacement)
        return -2; /* Trie doesn't have any to-be-replaced pattern */
    
    rd->cbf = callback;
    rd->user = param;
    rd->replace_mode = mode;
    
    thiz->text = instr; /* Save the input string in a helper variable 
                         * for convenience */
    
    current = thiz->last_node;
    
    /* Main replace loop: 
     * Find patterns and bookmark them 
     */
    while (position_r < instr->length)
    {
        if (!(next = node_find_next_bs(current, instr->astring[position_r])))
        {
            /* Failed to follow a pattern */
            if(current->failure_node)
                current = current->failure_node;
            else
                position_r++;
        }
        else
        {
            current = next;
            position_r++;
        }
        
        if (current->final && next)
        {
            /* Bookmark nominee patterns for replacement */
            nom.pattern = current->to_be_replaced;
            nom.position = thiz->base_position + position_r;
            
            mf_repdata_booknominee (rd, &nom);
        }
    }
    
    /* 
     * At the end of input chunk, if the tail of the chunk is a prefix of a
     * pattern, then we must keep it in the backlog buffer and wait for the 
     * next chunk to decide about it. */
    
    backlog_pos = thiz->base_position + instr->length - current->depth;
    
    /* Now replace the patterns up to the backlog_pos point */
    mf_repdata_do_replace (rd, backlog_pos);
    
    /* Save the remaining to the backlog buffer */
    mf_repdata_savetobacklog (rd, backlog_pos);
    
    /* Save status variables */
    thiz->last_node = current;
    thiz->base_position += position_r;
    
    return 0;
}